

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool IsJump(ParseNode *pnode)

{
  bool bVar1;
  ParseNodeStmt *pPVar2;
  uint uVar3;
  
  uVar3 = pnode->nop - 0x5b;
  if (0x14 < uVar3) {
    return false;
  }
  if ((0x1af2ffU >> (uVar3 & 0x1f) & 1) == 0) {
    bVar1 = true;
    if ((0x50c00U >> (uVar3 & 0x1f) & 1) == 0) {
      return false;
    }
  }
  else {
    pPVar2 = ParseNode::AsParseNodeStmt(pnode);
    bVar1 = (bool)((*(byte *)((long)&pPVar2->grfnop + 1) & 2) >> 1);
  }
  return bVar1;
}

Assistant:

bool IsJump(ParseNode *pnode)
{
    switch (pnode->nop)
    {
    case knopBreak:
    case knopContinue:
    case knopThrow:
    case knopReturn:
        return true;

    case knopBlock:
    case knopDoWhile:
    case knopWhile:
    case knopWith:
    case knopIf:
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
    case knopFor:
    case knopSwitch:
    case knopCase:
    case knopTryFinally:
    case knopTryCatch:
    case knopTry:
    case knopCatch:
    case knopFinally:
        return (pnode->AsParseNodeStmt()->grfnop & fnopJump) != 0;

    default:
        return false;
    }
}